

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

FStateLabel * __thiscall FStateLabels::FindLabel(FStateLabels *this,FName *label)

{
  int iVar1;
  int iVar2;
  FStateLabel *in_RAX;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  iVar1 = label->Index;
  iVar3 = this->NumLabels + -1;
  iVar5 = 0;
  do {
    if (iVar3 < iVar5) {
      return (FStateLabel *)0x0;
    }
    uVar4 = (uint)(iVar3 + iVar5) >> 1;
    iVar2 = this->Labels[uVar4].Label.Index;
    if (iVar2 == iVar1) {
      in_RAX = this->Labels + uVar4;
    }
    else if (iVar2 < iVar1) {
      iVar5 = uVar4 + 1;
    }
    else {
      iVar3 = uVar4 - 1;
    }
  } while (iVar2 != iVar1);
  return in_RAX;
}

Assistant:

FStateLabel *FStateLabels::FindLabel (FName label)
{
	return const_cast<FStateLabel *>(BinarySearch<FStateLabel, FName>(Labels, NumLabels, &FStateLabel::Label, label));
}